

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringview.h
# Opt level: O0

qsizetype __thiscall
QStringView::indexOf(QStringView *this,QChar c,qsizetype from,CaseSensitivity cs)

{
  QStringView str;
  char16_t *pcVar1;
  qsizetype qVar2;
  undefined2 in_SI;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  QChar in_stack_0000003e;
  undefined1 in_stack_00000040 [14];
  QChar local_2a;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 in_stack_fffffffffffffff4;
  CaseSensitivity cs_00;
  qsizetype from_00;
  
  from_00 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  cs_00 = CONCAT22(in_SI,in_stack_fffffffffffffff4);
  local_28 = *in_RDI;
  uStack_20 = in_RDI[1];
  pcVar1 = QChar::unicode((QChar *)&stack0xfffffffffffffff6);
  QChar::QChar<char16_t,_true>(&local_2a,*pcVar1);
  str.m_data._6_2_ = c.ucs;
  str._0_14_ = in_stack_00000040;
  qVar2 = QtPrivate::findString(str,from_00,in_stack_0000003e,cs_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == from_00) {
    return qVar2;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] qsizetype indexOf(QChar c, qsizetype from = 0, Qt::CaseSensitivity cs = Qt::CaseSensitive) const noexcept
    { return QtPrivate::findString(*this, from, c.unicode(), cs); }